

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O0

C_Token * new_token(C_Parser *tokenizer,C_TokenKind kind,char *start,char *end)

{
  C_Token *pCVar1;
  C_Token *tok;
  char *end_local;
  char *start_local;
  C_TokenKind kind_local;
  C_Parser *tokenizer_local;
  
  pCVar1 = (C_Token *)
           (*tokenizer->memory_allocator->calloc)(tokenizer->memory_allocator->arena,1,0x80);
  pCVar1->kind = kind;
  pCVar1->loc = start;
  pCVar1->len = (int)end - (int)start;
  pCVar1->file = tokenizer->current_file;
  pCVar1->filename = tokenizer->current_file->display_name;
  pCVar1->at_bol = (_Bool)(tokenizer->at_bol & 1);
  pCVar1->has_space = (_Bool)(tokenizer->has_space & 1);
  tokenizer->has_space = false;
  tokenizer->at_bol = false;
  return pCVar1;
}

Assistant:

static C_Token *new_token(C_Parser *tokenizer, C_TokenKind kind, char *start, char *end) {
  C_Token *tok = tokenizer->memory_allocator->calloc(tokenizer->memory_allocator->arena, 1, sizeof(C_Token));
  tok->kind = kind;
  tok->loc = start;
  tok->len = end - start;
  tok->file = tokenizer->current_file;
  tok->filename = tokenizer->current_file->display_name;
  tok->at_bol = tokenizer->at_bol;
  tok->has_space = tokenizer->has_space;

  tokenizer->at_bol = tokenizer->has_space = false;
  return tok;
}